

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder_tests.cpp
# Opt level: O2

void __thiscall
json_stream_encoder_reset_test_fixture::json_stream_encoder_reset_test_fixture
          (json_stream_encoder_reset_test_fixture *this)

{
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  string local_1b8 [32];
  stream_sink<char> local_198;
  undefined1 local_160 [66];
  undefined1 local_11e;
  undefined1 local_11c;
  string local_110 [248];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->output2);
  jsoncons::stream_sink<char>::stream_sink
            (&local_198,(basic_ostream<char,_std::char_traits<char>_> *)this);
  memset((basic_json_options<char> *)local_160,0,0x148);
  jsoncons::basic_json_options<char>::basic_json_options((basic_json_options<char> *)local_160);
  local_11c = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"",&local_1b9);
  std::__cxx11::string::_M_assign(local_110);
  local_11e = 0;
  jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
  basic_json_encoder(&this->encoder,&local_198,(basic_json_encode_options<char> *)(local_160 + 0x30)
                     ,&local_1ba);
  std::__cxx11::string::~string(local_1b8);
  jsoncons::basic_json_options<char>::~basic_json_options((basic_json_options<char> *)local_160);
  jsoncons::stream_sink<char>::~stream_sink(&local_198);
  return;
}

Assistant:

json_stream_encoder_reset_test_fixture()
        : encoder(output1,
                  json_options().indent_size(0).new_line_chars("")
                      .spaces_around_comma(spaces_option::no_spaces))
    {}